

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu1.c
# Opt level: O0

MPP_RET vdpu1_h264d_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MPP_RET MVar2;
  RK_U32 local_58;
  undefined4 uStack_54;
  HalTaskInfo *local_50;
  DecCbHalDone param;
  H264dVdpu1Regs_t *p_regs;
  H264dVdpuRegCtx_t *reg_ctx;
  H264dHalCtx_t *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x90);
  if (*(int *)((long)hal + 0x98) == 0) {
    _local_58 = *(undefined8 *)(lVar1 + 0xb0);
  }
  else {
    _local_58 = *(undefined8 *)(lVar1 + (long)(task->dec).reg_index * 0x30 + 0x28);
  }
  param.hard_err = local_58;
  param._20_4_ = uStack_54;
  if ((((task->dec).flags.val >> 2 & 1) == 0) &&
     (((((task->dec).flags.val >> 3 & 1) == 0 || (*(int *)(*(long *)((long)hal + 0x60) + 0x30) != 0)
       ) && (MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x88),0x10,(void *)0x0), MVar2 != MPP_OK)
      ))) {
    _mpp_log_l(2,"hal_h264d_vdpu1_reg","poll cmd failed %d\n","vdpu1_h264d_wait",(ulong)(uint)MVar2)
    ;
  }
  if (*(long *)((long)hal + 0x80) != 0) {
    param.task = *(void **)(lVar1 + 0xb0);
    param.regs._0_4_ = (uint)(((*(uint *)(param._16_8_ + 4) >> 0xc & 1) != 0 ^ 0xffU) & 1);
    local_50 = task;
    mpp_callback_f("vdpu1_h264d_wait",*(MppCbCtx **)((long)hal + 0x80),&local_50);
  }
  memset((void *)(param._16_8_ + 4),0,4);
  if (*(int *)((long)hal + 0x98) != 0) {
    *(undefined4 *)(lVar1 + (long)(task->dec).reg_index * 0x30) = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu1_h264d_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t  *p_hal = (H264dHalCtx_t *)hal;
    H264dVdpuRegCtx_t *reg_ctx = (H264dVdpuRegCtx_t *)p_hal->reg_ctx;
    H264dVdpu1Regs_t *p_regs = (H264dVdpu1Regs_t *)(p_hal->fast_mode ?
                                                    reg_ctx->reg_buf[task->dec.reg_index].regs :
                                                    reg_ctx->regs);

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !p_hal->cfg->base.disable_error)) {
        goto __SKIP_HARD;
    }

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

__SKIP_HARD:
    if (p_hal->dec_cb) {
        DecCbHalDone param;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)reg_ctx->regs;
        param.hard_err = !p_regs->SwReg01.sw_dec_rdy_int;

        mpp_callback(p_hal->dec_cb, &param);
    }
    memset(&p_regs->SwReg01, 0, sizeof(RK_U32));
    if (p_hal->fast_mode) {
        reg_ctx->reg_buf[task->dec.reg_index].valid = 0;
    }
    (void)task;

    return ret = MPP_OK;
}